

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

double duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<unsigned_long,double>
                 (unsigned_long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  undefined8 in_RCX;
  VectorTryCastData *data;
  double output;
  unsigned_long in_stack_00000178;
  double *in_stack_ffffffffffffff88;
  VectorTryCastData *cast_data;
  idx_t in_stack_ffffffffffffff90;
  ValidityMask *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  VectorTryCastData local_58;
  undefined8 local_38;
  double local_30;
  undefined8 local_28;
  double local_8;
  
  local_28 = in_RCX;
  bVar1 = NumericTryCast::Operation<unsigned_long,double>
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,false);
  if (bVar1) {
    local_8 = local_30;
  }
  else {
    local_38 = local_28;
    cast_data = &local_58;
    CastExceptionText<unsigned_long,double>(in_stack_00000178);
    local_8 = HandleVectorCastError::Operation<double>
                        (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                         in_stack_ffffffffffffff90,cast_data);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  return local_8;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}